

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O1

ixy_device * ixgbe_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues,int interrupt_timeout)

{
  uint16_t *puVar1;
  uint8_t **ppuVar2;
  uint16_t *puVar3;
  long *plVar4;
  _Bool _Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __uid_t _Var8;
  int iVar9;
  uint uVar10;
  ixgbe_device *piVar11;
  char *pcVar12;
  uint8_t *puVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  pkt_buf *ppVar17;
  uint64_t uVar18;
  ulong uVar19;
  ixy_device *piVar20;
  ixy_device *piVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  long extraout_RDX;
  long extraout_RDX_00;
  ixgbe_device *dev;
  ulong uVar25;
  ulong uVar26;
  uint16_t queue_id;
  long *plVar27;
  uint uVar28;
  undefined6 in_register_00000032;
  stat *__buf;
  stat *psVar29;
  long lVar30;
  ushort uVar31;
  ushort uVar32;
  ulong uVar33;
  ulong uVar34;
  interrupt_queues *interrupt;
  bool bVar35;
  ushort uStackY_119c;
  stat buffer;
  char path [4096];
  
  __buf = (stat *)CONCAT62(in_register_00000032,rx_queues);
  uVar10 = interrupt_timeout;
  _Var8 = getuid();
  if (_Var8 != 0) {
    ixgbe_init_cold_1();
  }
  if (rx_queues < 0x41) {
    if (tx_queues < 0x41) {
      piVar11 = (ixgbe_device *)malloc(0x88);
      pcVar12 = strdup(pci_addr);
      (piVar11->ixy).pci_addr = pcVar12;
      pcVar12 = pci_addr;
      snprintf(path,0x1000,"/sys/bus/pci/devices/%s/iommu_group");
      uVar10 = (uint)pcVar12;
      __buf = &buffer;
      iVar9 = stat(path,(stat *)__buf);
      (piVar11->ixy).vfio = iVar9 == 0;
      if (iVar9 != 0) {
LAB_001054ec:
        (piVar11->ixy).driver_name = driver_name;
        (piVar11->ixy).num_rx_queues = rx_queues;
        (piVar11->ixy).num_tx_queues = tx_queues;
        (piVar11->ixy).rx_batch = ixgbe_rx_batch;
        (piVar11->ixy).tx_batch = ixgbe_tx_batch;
        (piVar11->ixy).read_stats = ixgbe_read_stats;
        (piVar11->ixy).set_promisc = ixgbe_set_promisc;
        (piVar11->ixy).get_link_speed = ixgbe_get_link_speed;
        (piVar11->ixy).get_mac_addr = ixgbe_get_mac_addr;
        (piVar11->ixy).set_mac_addr = ixgbe_set_mac_addr;
        (piVar11->ixy).interrupts.interrupts_enabled = interrupt_timeout != 0;
        (piVar11->ixy).interrupts.itr_rate = 0x28;
        (piVar11->ixy).interrupts.timeout_ms = interrupt_timeout;
        if ((interrupt_timeout != 0) && ((piVar11->ixy).vfio == false)) {
          ixgbe_init_cold_2();
        }
        puVar1 = &(piVar11->ixy).num_rx_queues;
        if ((piVar11->ixy).vfio == true) {
          ixgbe_init_cold_3();
        }
        else {
          fprintf(_stderr,"[DEBUG] %s:%d %s(): mapping BAR0 region via pci file...\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                  ,0x238,"ixgbe_init");
          puVar13 = pci_map_resource(pci_addr);
          piVar11->addr = puVar13;
        }
        pvVar14 = calloc((ulong)rx_queues,0x8018);
        piVar11->rx_queues = pvVar14;
        pvVar14 = calloc((ulong)tx_queues,0x8010);
        piVar11->tx_queues = pvVar14;
        fprintf(_stdout,"[INFO ] %s:%d %s(): Resetting device %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1bf,"reset_and_init",(piVar11->ixy).pci_addr);
        puVar13 = piVar11->addr;
        puVar13[0x880] = '\0';
        puVar13[0x881] = '\0';
        puVar13[0x882] = '\0';
        puVar13[0x883] = '\0';
        puVar13 = piVar11->addr;
        puVar13[0x888] = 0xff;
        puVar13[0x889] = 0xff;
        puVar13[0x88a] = 0xff;
        puVar13[0x88b] = 0xff;
        puVar13 = piVar11->addr;
        puVar13[0] = '\b';
        puVar13[1] = '\0';
        puVar13[2] = '\0';
        puVar13[3] = '\x04';
        if ((*(uint *)piVar11->addr & 0x4000008) != 0) {
          ixgbe_init_cold_4();
        }
        ppuVar2 = &piVar11->addr;
        usleep(10000);
        puVar13 = piVar11->addr;
        puVar13[0x880] = '\0';
        puVar13[0x881] = '\0';
        puVar13[0x882] = '\0';
        puVar13[0x883] = '\0';
        puVar13 = piVar11->addr;
        puVar13[0x888] = 0xff;
        puVar13[0x889] = 0xff;
        puVar13[0x88a] = 0xff;
        puVar13[0x88b] = 0xff;
        uVar10 = *(uint *)(piVar11->addr + 0x5400);
        uVar22 = *(uint *)(piVar11->addr + 0x5404);
        uVar19 = (ulong)(uVar10 >> 0x18);
        fprintf(_stdout,"[INFO ] %s:%d %s(): Initializing device %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1cd,"reset_and_init",(piVar11->ixy).pci_addr,uVar19);
        fprintf(_stdout,"[INFO ] %s:%d %s(): MAC address %02x:%02x:%02x:%02x:%02x:%02x\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1ce,"reset_and_init",(ulong)(uVar10 & 0xff),(ulong)(uVar10 >> 8 & 0xff),
                (ulong)(uVar10 >> 0x10 & 0xff),uVar19,(ulong)(uVar22 & 0xff),
                (ulong)(uVar22 >> 8 & 0xff));
        if ((*(uint *)(piVar11->addr + 0x10010) >> 9 & 1) == 0) {
          ixgbe_init_cold_5();
        }
        if ((*(uint *)(*ppuVar2 + 0x2f00) & 8) == 0) {
          ixgbe_init_cold_6();
        }
        puVar3 = &(piVar11->ixy).num_tx_queues;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) & 0xffff1fff | 0x6000;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) & 0xfffffe7f;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) | 0x1000;
        *(uint *)(*ppuVar2 + 0x3000) = *(uint *)(*ppuVar2 + 0x3000) & 0xfffffffe;
        puVar13 = *ppuVar2;
        puVar13[0x3c00] = '\0';
        puVar13[0x3c01] = '\0';
        puVar13[0x3c02] = '\x02';
        puVar13[0x3c03] = '\0';
        lVar15 = 0;
        do {
          puVar13 = *ppuVar2 + lVar15 * 4 + 0x3c04;
          puVar13[0] = '\0';
          puVar13[1] = '\0';
          puVar13[2] = '\0';
          puVar13[3] = '\0';
          lVar15 = lVar15 + 1;
        } while (lVar15 != 7);
        *(uint *)(*ppuVar2 + 0x4240) = *(uint *)(*ppuVar2 + 0x4240) | 2;
        *(uint *)(*ppuVar2 + 0x2f00) = *(uint *)(*ppuVar2 + 0x2f00) | 2;
        *(uint *)(*ppuVar2 + 0x5080) = *(uint *)(*ppuVar2 + 0x5080) | 0x400;
        if (*puVar1 != 0) {
          ixgbe_init_cold_7();
        }
        *(uint *)(*ppuVar2 + 0x18) = *(uint *)(*ppuVar2 + 0x18) | 0x10000;
        if (*puVar1 != 0) {
          uVar10 = 0;
          uVar22 = 0x2200;
          do {
            uVar28 = uVar22;
            if (0xf < uVar10) {
              if (uVar10 < 0x40) {
                uVar28 = uVar10 * 0x40 | 0x100c;
              }
              else {
                uVar28 = uVar10 * 0x40 + 0xc00c;
              }
            }
            *(uint *)(*ppuVar2 + (int)uVar28) = *(uint *)(*ppuVar2 + (int)uVar28) & 0xffffefff;
            uVar10 = uVar10 + 1;
            uVar22 = uVar22 + 4;
          } while (uVar10 < *puVar1);
        }
        *(uint *)(*ppuVar2 + 0x3000) = *(uint *)(*ppuVar2 + 0x3000) | 1;
        *(uint *)(*ppuVar2 + 0x4240) = *(uint *)(*ppuVar2 + 0x4240) | 0x401;
        puVar13 = *ppuVar2;
        puVar13[0xcc00] = '\0';
        puVar13[0xcc01] = 0xa0;
        puVar13[0xcc02] = '\0';
        puVar13[0xcc03] = '\0';
        lVar15 = 0;
        do {
          puVar13 = *ppuVar2 + lVar15 * 4 + 0xcc04;
          puVar13[0] = '\0';
          puVar13[1] = '\0';
          puVar13[2] = '\0';
          puVar13[3] = '\0';
          lVar15 = lVar15 + 1;
        } while (lVar15 != 7);
        puVar13 = *ppuVar2;
        puVar13[0x8100] = 0xff;
        puVar13[0x8101] = 0xff;
        puVar13[0x8102] = '\0';
        puVar13[0x8103] = '\0';
        *(uint *)(*ppuVar2 + 0x4900) = *(uint *)(*ppuVar2 + 0x4900) & 0xffffffbf;
        if (*puVar3 != 0) {
          ixgbe_init_cold_8();
        }
        puVar13 = *ppuVar2;
        puVar13[0x4a80] = '\x01';
        puVar13[0x4a81] = '\0';
        puVar13[0x4a82] = '\0';
        puVar13[0x4a83] = '\0';
        if (*puVar1 != 0) {
          ixgbe_init_cold_9();
        }
        if (*puVar3 != 0) {
          ixgbe_init_cold_10();
        }
        if (*puVar1 != 0) {
          queue_id = 0;
          do {
            enable_interrupt(piVar11,queue_id);
            queue_id = queue_id + 1;
          } while (queue_id < (piVar11->ixy).num_rx_queues);
        }
        uVar10 = 0;
        fprintf(_stdout,"[INFO ] %s:%d %s(): enabling promisc mode\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x271,"ixgbe_set_promisc");
        *(uint *)(*ppuVar2 + 0x5080) = *(uint *)(*ppuVar2 + 0x5080) | 0x300;
        fprintf(_stdout,"[INFO ] %s:%d %s(): Waiting for link...\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1b3,"wait_for_link");
        if (((byte)(*(uint *)(*ppuVar2 + 0x42a4) >> 0x1e) &
            (*(uint *)(*ppuVar2 + 0x42a4) & 0x30000000) != 0) == 0) {
          iVar9 = -9900000;
          do {
            usleep(100000);
            if (((byte)(*(uint *)(*ppuVar2 + 0x42a4) >> 0x1e) &
                (*(uint *)(*ppuVar2 + 0x42a4) & 0x30000000) != 0) != 0) break;
            bVar35 = iVar9 != 0;
            iVar9 = iVar9 + 100000;
          } while (bVar35);
        }
        if ((*(uint *)(*ppuVar2 + 0x42a4) >> 0x1e & 1) != 0) {
          uVar10 = *(uint *)(&DAT_00108800 + (ulong)(*(uint *)(*ppuVar2 + 0x42a4) >> 0x1c & 3) * 4);
        }
        fprintf(_stdout,"[INFO ] %s:%d %s(): Link speed is %d Mbit/s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1ba,"wait_for_link",(ulong)uVar10);
        return &piVar11->ixy;
      }
      iVar9 = vfio_init(pci_addr);
      (piVar11->ixy).vfio_fd = iVar9;
      if (-1 < iVar9) goto LAB_001054ec;
      goto LAB_00105b38;
    }
  }
  else {
    ixgbe_init_cold_13();
  }
  ixgbe_init_cold_12();
LAB_00105b38:
  ixgbe_init_cold_11();
  _Var5 = (((ixgbe_device *)pci_addr)->ixy).interrupts.interrupts_enabled;
  uVar19 = (ulong)__buf & 0xffff;
  if (_Var5 == true) {
    interrupt = (((ixgbe_device *)pci_addr)->ixy).interrupts.queues + uVar19;
  }
  else {
    interrupt = (interrupt_queues *)0x0;
  }
  psVar29 = __buf;
  piVar11 = (ixgbe_device *)pci_addr;
  if ((_Var5 != false) && (interrupt->interrupt_enabled == true)) {
    piVar11 = (ixgbe_device *)(ulong)(uint)interrupt->vfio_epoll_fd;
    psVar29 = (stat *)0xa;
    vfio_epoll_wait(interrupt->vfio_epoll_fd,10,
                    (((ixgbe_device *)pci_addr)->ixy).interrupts.timeout_ms);
  }
  plVar4 = (long *)((long)((ixgbe_device *)pci_addr)->rx_queues + uVar19 * 0x18);
  uVar32 = *(ushort *)((long)plVar4 + 0x12);
  uVar16 = (ulong)uVar32;
  uVar22 = (uint)uVar32;
  if (uVar10 == 0) {
    uVar26 = 0;
LAB_00105c99:
    if (uVar32 != (ushort)uVar22) {
      uVar23 = (int)uVar19 * 0x40;
      uVar28 = uVar23 + 0xc018;
      if ((ushort)__buf < 0x40) {
        uVar28 = uVar23 | 0x1018;
      }
      *(uint *)(((ixgbe_device *)pci_addr)->addr + uVar28) = uVar22 & 0xffff;
      *(ushort *)((long)plVar4 + 0x12) = uVar32;
    }
    if (_Var5 != false) {
      uVar19 = interrupt->instr_counter;
      auVar7 = vpmovsxbq_avx(ZEXT216(0x101));
      auVar6 = vpinsrq_avx(auVar7,uVar26 & 0xffffffff,1);
      auVar7._0_8_ = interrupt->instr_counter;
      auVar7._8_8_ = interrupt->rx_pkts;
      auVar7 = vpaddq_avx(auVar6,auVar7);
      interrupt->instr_counter = auVar7._0_8_;
      interrupt->rx_pkts = auVar7._8_8_;
      if ((uVar19 & 0xfff) == 0) {
        _Var5 = interrupt->interrupt_enabled;
        uVar18 = monotonic_time();
        uVar19 = uVar18 - interrupt->last_time_checked;
        if (interrupt->interval < uVar19) {
          check_interrupt(interrupt,uVar19,(uint32_t)uVar26,uVar10);
        }
        if (_Var5 != interrupt->interrupt_enabled) {
          if (interrupt->interrupt_enabled == false) {
            ixgbe_rx_batch_cold_3();
          }
          else {
            enable_interrupt((ixgbe_device *)pci_addr,(ushort)__buf);
          }
        }
      }
    }
    return (ixy_device *)(uVar26 & 0xffffffff);
  }
  uVar25 = 0;
  uVar33 = uVar16;
  while( true ) {
    iVar9 = (int)psVar29;
    uVar26 = uVar33 & 0xffff;
    uVar22 = (int)uVar26 << 4;
    uVar28 = *(uint *)(*plVar4 + 8 + (ulong)uVar22);
    uVar34 = uVar33;
    if ((uVar28 & 1) != 0) break;
LAB_00105c79:
    uVar32 = (ushort)uVar34;
    uVar22 = (uint)uVar16;
    uVar26 = uVar25;
    if (((uVar28 & 1) == 0) ||
       (uVar25 = uVar25 + 1, uVar26 = (ulong)uVar10, uVar33 = uVar34, uVar10 == uVar25))
    goto LAB_00105c99;
  }
  if ((uVar28 & 2) != 0) {
    plVar27 = (long *)(*plVar4 + (ulong)uVar22);
    uVar22 = (uint)*(ushort *)((long)plVar27 + 0xe);
    lVar15 = plVar4[uVar26 + 3];
    *(uint *)(lVar15 + 0x14) = (uint)*(ushort *)((long)plVar27 + 0xc);
    piVar11 = (ixgbe_device *)plVar4[1];
    ppVar17 = pkt_buf_alloc((mempool *)piVar11);
    iVar9 = (int)psVar29;
    if (ppVar17 != (pkt_buf *)0x0) {
      *plVar27 = ppVar17->buf_addr_phy + 0x40;
      plVar27[1] = 0;
      plVar4[uVar26 + 3] = (long)ppVar17;
      *(long *)(extraout_RDX + uVar25 * 8) = lVar15;
      uVar34 = (ulong)((int)plVar4[2] - 1U & (int)uVar33 + 1U);
      uVar16 = uVar33;
      goto LAB_00105c79;
    }
    ixgbe_rx_batch_cold_1();
  }
  ixgbe_rx_batch_cold_2();
  plVar4 = (long *)((long)piVar11->tx_queues + (ulong)(uint)(iVar9 << 4));
  uVar10 = (uint)*(ushort *)((long)piVar11->tx_queues + (ulong)(uint)(iVar9 << 4) + 10);
  do {
    uVar28 = uVar10 & 0xffff;
    iVar24 = *(ushort *)((long)plVar4 + 0xc) - uVar28;
    if (iVar24 < 0) {
      iVar24 = iVar24 + (uint)*(ushort *)(plVar4 + 1);
    }
    bVar35 = false;
    if (0x1f < iVar24) {
      uVar23 = (uint)*(ushort *)(plVar4 + 1);
      if (uVar28 + 0x1f < (uint)*(ushort *)(plVar4 + 1)) {
        uVar23 = 0;
      }
      uVar23 = (uVar28 + 0x1f) - uVar23;
      if ((*(uint *)(*plVar4 + 0xc + (long)(int)uVar23 * 0x10) & 1) != 0) {
        for (; pkt_buf_free((pkt_buf *)plVar4[(ulong)uVar28 + 2]), uVar28 != uVar23;
            uVar28 = (int)plVar4[1] - 1U & uVar28 + 1 & 0xffff) {
        }
        uVar10 = (int)plVar4[1] - 1U & uVar23 + 1;
        bVar35 = true;
      }
    }
  } while (bVar35);
  *(ushort *)((long)plVar4 + 10) = (ushort)uVar10;
  piVar20 = (ixy_device *)0x0;
  piVar21 = piVar20;
  if (uVar22 != 0) {
    do {
      uVar32 = *(ushort *)((long)plVar4 + 0xc);
      uVar31 = (short)(int)plVar4[1] - 1U & uVar32 + 1;
      piVar21 = piVar20;
      if ((ushort)uVar10 == uVar31) break;
      plVar27 = *(long **)(extraout_RDX_00 + (long)piVar20 * 8);
      plVar4[(ulong)uVar32 + 2] = (long)plVar27;
      lVar15 = *plVar4;
      lVar30 = (ulong)uVar32 * 0x10;
      *(ushort *)((long)plVar4 + 0xc) = uVar31;
      *(long *)(lVar15 + lVar30) = *plVar27 + 0x40;
      *(uint *)(lVar15 + 8 + lVar30) = *(uint *)((long)plVar27 + 0x14) | 0x2b300000;
      *(int *)(lVar15 + 0xc + lVar30) = *(int *)((long)plVar27 + 0x14) << 0xe;
      piVar20 = (ixy_device *)((long)&piVar20->pci_addr + 1);
      piVar21 = (ixy_device *)(ulong)uVar22;
    } while ((ixy_device *)(ulong)uVar22 != piVar20);
  }
  uStackY_119c = (ushort)iVar9;
  *(uint *)(piVar11->addr + (ulong)uStackY_119c * 0x40 + 0x6018) =
       (uint)*(ushort *)((long)plVar4 + 0xc);
  return piVar21;
}

Assistant:

struct ixy_device* ixgbe_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues, int interrupt_timeout) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > MAX_QUEUES) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, MAX_QUEUES);
	}
	if (tx_queues > MAX_QUEUES) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, MAX_QUEUES);
	}

	// Allocate memory for the ixgbe device that will be returned
	struct ixgbe_device* dev = (struct ixgbe_device*) malloc(sizeof(struct ixgbe_device));
	dev->ixy.pci_addr = strdup(pci_addr);

	// Check if we want the VFIO stuff
	// This is done by checking if the device is in an IOMMU group.
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/iommu_group", pci_addr);
	struct stat buffer;
	dev->ixy.vfio = stat(path, &buffer) == 0;
	if (dev->ixy.vfio) {
		// initialize the IOMMU for this device
		dev->ixy.vfio_fd = vfio_init(pci_addr);
		if (dev->ixy.vfio_fd < 0) {
			error("could not initialize the IOMMU for device %s", pci_addr);
		}
	}
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = ixgbe_rx_batch;
	dev->ixy.tx_batch = ixgbe_tx_batch;
	dev->ixy.read_stats = ixgbe_read_stats;
	dev->ixy.set_promisc = ixgbe_set_promisc;
	dev->ixy.get_link_speed = ixgbe_get_link_speed;
	dev->ixy.get_mac_addr = ixgbe_get_mac_addr;
	dev->ixy.set_mac_addr = ixgbe_set_mac_addr;
	dev->ixy.interrupts.interrupts_enabled = interrupt_timeout != 0;
	// 0x028 (10ys) => 97600 INT/s
	dev->ixy.interrupts.itr_rate = 0x028;
	dev->ixy.interrupts.timeout_ms = interrupt_timeout;

	if (!dev->ixy.vfio && interrupt_timeout != 0) {
		warn("Interrupts requested but VFIO not available: Disabling Interrupts!");
		dev->ixy.interrupts.interrupts_enabled = false;
	}

	// Map BAR0 region
	if (dev->ixy.vfio) {
		debug("mapping BAR0 region via VFIO...");
		dev->addr = vfio_map_region(dev->ixy.vfio_fd, VFIO_PCI_BAR0_REGION_INDEX);
		// initialize interrupts for this device
		setup_interrupts(dev);
	} else {
		debug("mapping BAR0 region via pci file...");
		dev->addr = pci_map_resource(pci_addr);
	}
	dev->rx_queues = calloc(rx_queues, sizeof(struct ixgbe_rx_queue) + sizeof(void*) * MAX_RX_QUEUE_ENTRIES);
	dev->tx_queues = calloc(tx_queues, sizeof(struct ixgbe_tx_queue) + sizeof(void*) * MAX_TX_QUEUE_ENTRIES);
	reset_and_init(dev);
	return &dev->ixy;
}